

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O1

Light_SampleRes *
embree::DirectionalLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar8 = *(undefined8 *)(super + 0xe);
  *(undefined8 *)&(__return_storage_ptr__->dir).field_0 = *(undefined8 *)(super + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->dir).field_0 + 8) = uVar8;
  __return_storage_ptr__->dist = INFINITY;
  __return_storage_ptr__->pdf = (float)super[0x15].type;
  if ((float)super[0x14].type < 0.9999999) {
    fVar9 = (s->field_0).field_0.x * 6.2831855;
    fVar13 = 1.0 - (1.0 - (float)super[0x14].type) * (s->field_0).field_0.y;
    fVar10 = 1.0 - fVar13 * fVar13;
    if (fVar10 <= 0.0) {
      fVar10 = 0.0;
    }
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar11 = sinf(fVar9);
    fVar12 = cosf(fVar9);
    fVar12 = fVar12 * fVar10;
    fVar11 = fVar11 * fVar10;
    fVar9 = (float)super[0xd].type;
    fVar10 = (float)super[0xe].type;
    fVar1 = (float)super[0xf].type;
    fVar2 = (float)super[9].type;
    fVar3 = (float)super[10].type;
    fVar4 = (float)super[0xb].type;
    fVar5 = (float)super[5].type;
    fVar6 = (float)super[6].type;
    fVar7 = (float)super[7].type;
    (__return_storage_ptr__->dir).field_0.m128[0] =
         fVar12 * (float)super[4].type +
         fVar11 * (float)super[8].type + fVar13 * (float)super[0xc].type;
    (__return_storage_ptr__->dir).field_0.m128[1] = fVar12 * fVar5 + fVar11 * fVar2 + fVar13 * fVar9
    ;
    (__return_storage_ptr__->dir).field_0.m128[2] =
         fVar12 * fVar6 + fVar11 * fVar3 + fVar13 * fVar10;
    (__return_storage_ptr__->dir).field_0.m128[3] = fVar12 * fVar7 + fVar11 * fVar4 + fVar13 * fVar1
    ;
  }
  uVar8 = *(undefined8 *)(super + 0x12);
  *(undefined8 *)&(__return_storage_ptr__->weight).field_0 = *(undefined8 *)(super + 0x10);
  *(undefined8 *)((long)&(__return_storage_ptr__->weight).field_0 + 8) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes DirectionalLight_sample(const Light* super,
                                                                     const DifferentialGeometry& dg,
                                                                     const Vec2f& s)
{
  const DirectionalLight* self = (DirectionalLight*)super;
  Light_SampleRes res;

  res.dir = self->frame.vz;
  res.dist = inf;
  res.pdf = self->pdf;

  if (self->cosAngle < COS_ANGLE_MAX)
    res.dir = self->frame * uniformSampleCone(self->cosAngle, s);

  res.weight = self->radiance; // *pdf/pdf cancel

  return res;
}